

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribUintCase::test
          (CurrentVertexAttribUintCase *this)

{
  ostringstream *this_00;
  CallLogWrapper *this_01;
  TestContext *this_02;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  GLuint local_218;
  int attribute_count;
  CallLogWrapper *local_208;
  CurrentVertexAttribUintCase *local_200;
  TestContext *local_1f8;
  StateQueryMemoryWriteGuard<unsigned_int[4]> attribValue;
  Random rnd;
  undefined1 local_1b0 [384];
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  attribute_count = 0x10;
  local_208 = &(this->super_ApiCase).super_CallLogWrapper;
  local_200 = this;
  glu::CallLogWrapper::glGetIntegerv(local_208,0x8869,&attribute_count);
  for (local_218 = 0; (int)local_218 < attribute_count; local_218 = local_218 + 1) {
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    this_01 = local_208;
    glu::CallLogWrapper::glVertexAttribI4ui
              (local_208,local_218,dVar1 % 0xfa01,dVar2 % 0xfa01,dVar3 % 0xfa01,dVar4 % 0xfa01);
    local_1f8 = (local_200->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[4]>::
    StateQueryMemoryWriteGuard(&attribValue);
    this_00 = (ostringstream *)(local_1b0 + 8);
    glu::CallLogWrapper::glGetVertexAttribIuiv(this_01,local_218,0x8626,attribValue.m_value);
    this_02 = local_1f8;
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
              (&attribValue,local_1f8);
    if ((((attribValue.m_value[0] != dVar1 % 0xfa01) || (attribValue.m_value[1] != dVar2 % 0xfa01))
        || (attribValue.m_value[2] != dVar3 % 0xfa01)) || (attribValue.m_value[3] != dVar4 % 0xfa01)
       ) {
      local_1b0._0_8_ = this_02->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"// ERROR: Expected [");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,"];");
      std::operator<<((ostream *)this_00,"got [");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,",");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (this_02->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(this_02,QP_TEST_RESULT_FAIL,"got invalid attribute value");
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLuint x = rnd.getInt(0, 64000);
			const GLuint y = rnd.getInt(0, 64000);
			const GLuint z = rnd.getInt(0, 64000);
			const GLuint w = rnd.getInt(0, 64000);

			glVertexAttribI4ui(index, x, y, z, w);
			verifyCurrentVertexAttribIui(m_testCtx, *this, index, x, y, z, w);
		}
	}